

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

void __thiscall
icu_63::VTimeZone::endZoneProps(VTimeZone *this,VTZWriter *writer,UBool isDst,UErrorCode *status)

{
  UBool UVar1;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 extraout_DL_03;
  undefined1 uVar2;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  undefined7 extraout_var_03;
  undefined7 uVar3;
  UErrorCode *status_local;
  UBool isDst_local;
  VTZWriter *writer_local;
  VTimeZone *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    VTZWriter::write(writer,0x4327d2,(void *)CONCAT71(extraout_var,extraout_DL),(size_t)status);
    VTZWriter::write(writer,0x3a,(void *)CONCAT71(extraout_var_00,extraout_DL_00),(size_t)status);
    if (isDst == '\0') {
      VTZWriter::write(writer,0x4327c0,(void *)CONCAT71(extraout_var_01,extraout_DL_01),
                       (size_t)status);
      uVar2 = extraout_DL_03;
      uVar3 = extraout_var_03;
    }
    else {
      VTZWriter::write(writer,0x4327a0,(void *)CONCAT71(extraout_var_01,extraout_DL_01),
                       (size_t)status);
      uVar2 = extraout_DL_02;
      uVar3 = extraout_var_02;
    }
    VTZWriter::write(writer,0x43284e,(void *)CONCAT71(uVar3,uVar2),(size_t)status);
  }
  return;
}

Assistant:

void
VTimeZone::endZoneProps(VTZWriter& writer, UBool isDst, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }
    // END:STANDARD or END:DAYLIGHT
    writer.write(ICAL_END);
    writer.write(COLON);
    if (isDst) {
        writer.write(ICAL_DAYLIGHT);
    } else {
        writer.write(ICAL_STANDARD);
    }
    writer.write(ICAL_NEWLINE);
}